

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O2

Gia_Man_t * Acec_DetectAdditional(Gia_Man_t *p,int fVerbose)

{
  abctime aVar1;
  Vec_Int_t *vRootXorSet;
  Gia_Man_t *pGVar2;
  abctime aVar3;
  abctime time;
  char *pStr;
  
  Abc_Clock();
  aVar1 = Abc_Clock();
  vRootXorSet = Acec_CollectXorTops(p);
  if (vRootXorSet == (Vec_Int_t *)0x0) {
    pGVar2 = Gia_ManDup(p);
  }
  else {
    Acec_DetectComputeSupports(p,vRootXorSet);
    pGVar2 = Acec_DetectXorBuildNew(p,vRootXorSet);
    Vec_IntFree(vRootXorSet);
  }
  pStr = (char *)((long)vRootXorSet->nSize / 4 & 0xffffffff);
  printf("Detected %d top XORs.  ",pStr,(long)vRootXorSet->nSize % 4 & 0xffffffff);
  aVar3 = Abc_Clock();
  Abc_PrintTime((int)aVar3 - (int)aVar1,pStr,time);
  return pGVar2;
}

Assistant:

Gia_Man_t * Acec_DetectAdditional( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Vec_Int_t * vRootXorSet;
//    Vec_Int_t * vXors, * vAdds = Ree_ManComputeCuts( p, &vXors, 0 );

    //Ree_ManPrintAdders( vAdds, 1 );
//    printf( "Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ", Ree_ManCountFadds(vAdds), Vec_IntSize(vAdds)/6-Ree_ManCountFadds(vAdds), Vec_IntSize(vXors)/4 );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vRootXorSet = Acec_CollectXorTops( p );
    if ( vRootXorSet )
    {
        Acec_DetectComputeSupports( p, vRootXorSet );

        pNew = Acec_DetectXorBuildNew( p, vRootXorSet );
        Vec_IntFree( vRootXorSet );
    }
    else
        pNew = Gia_ManDup( p );

    printf( "Detected %d top XORs.  ", Vec_IntSize(vRootXorSet)/4 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

//    Vec_IntFree( vXors );
//    Vec_IntFree( vAdds );
    return pNew;
}